

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDefinition
          (ExtensionGenerator *this,Printer *printer)

{
  Options *options;
  FieldDescriptor *pFVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  mapped_type *s;
  long *plVar5;
  undefined8 *puVar6;
  Descriptor *pDVar7;
  LogMessage *other;
  undefined1 qualified;
  Options *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  _Alloc_hider _Var9;
  string default_str;
  Formatter format;
  string local_140;
  key_type local_120;
  undefined1 local_100 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  Formatter local_68;
  
  if (((this->options_).lite_implicit_weak_fields != true) ||
     (iVar4 = std::__cxx11::string::compare
                        ((char *)**(undefined8 **)(*(long *)(this->descriptor_ + 0x20) + 0x10)),
     iVar4 != 0)) {
    local_68.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this->descriptor_;
    if (*(once_flag **)(paVar8->_M_local_buf + 0x18) != (once_flag *)0x0) {
      local_100._0_8_ = FieldDescriptor::TypeOnceInit;
      local_140._M_dataplus._M_p = (pointer)paVar8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar8->_M_local_buf + 0x18),
                 (_func_void_FieldDescriptor_ptr **)local_100,(FieldDescriptor **)&local_140);
    }
    options = &this->options_;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                (ulong)(byte)*(FieldDescriptor *)(paVar8->_M_local_buf + 2) * 4) == 9) {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"scoped_name","");
      s = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&this->variables_,&local_120);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"::","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_","");
      StringReplace(&local_140,s,&local_a8,&local_88,true);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_100 + 0x10);
      field = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == field) {
        local_100._16_8_ = field->_M_allocated_capacity;
        local_100._24_8_ = plVar5[3];
        local_100._0_8_ = paVar8;
      }
      else {
        local_100._16_8_ = field->_M_allocated_capacity;
        local_100._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar5;
      }
      local_100._8_8_ = plVar5[1];
      *plVar5 = (long)field;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != paVar8) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      DefaultValue_abi_cxx11_
                ((string *)local_100,(cpp *)options,(Options *)this->descriptor_,
                 (FieldDescriptor *)field->_M_local_buf);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      Formatter::operator()(&local_68,"const std::string $1$($2$);\n",&local_c8,args_1);
      qualified = SUB81(args_1,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != paVar8) {
        operator_delete((void *)local_100._0_8_);
      }
    }
    else {
      pDVar7 = FieldDescriptor::message_type(this->descriptor_);
      if (pDVar7 == (Descriptor *)0x0) {
        DefaultValue_abi_cxx11_
                  ((string *)local_100,(cpp *)options,(Options *)this->descriptor_,
                   (FieldDescriptor *)in_RCX);
        qualified = SUB81(in_RCX,0);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_100);
        psVar2 = (string *)local_100;
        _Var9._M_p = (pointer)local_100._0_8_;
      }
      else {
        FieldMessageTypeName_abi_cxx11_
                  (&local_140,(cpp *)this->descriptor_,(FieldDescriptor *)options,in_RCX);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar8) {
          local_100._16_8_ = paVar8->_M_allocated_capacity;
          local_100._24_8_ = puVar6[3];
          local_100._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_100 + 0x10);
        }
        else {
          local_100._16_8_ = paVar8->_M_allocated_capacity;
          local_100._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
        }
        local_100._8_8_ = puVar6[1];
        *puVar6 = paVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_100);
        qualified = SUB81(paVar8,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_);
        }
        psVar2 = &local_140;
        _Var9._M_p = local_140._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &psVar2->field_2) {
        operator_delete(_Var9._M_p);
      }
    }
    bVar3 = IsScoped(this);
    if (bVar3) {
      Formatter::operator()<>
                (&local_68,
                 "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\nconst int $scope$$constant_name$;\n#endif\n"
                );
    }
    Formatter::operator()
              (&local_68,
               "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n  $scoped_name$($constant_name$, $1$);\n"
               ,&local_c8);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this->descriptor_;
    if (*(once_flag **)(paVar8->_M_local_buf + 0x18) != (once_flag *)0x0) {
      local_100._0_8_ = FieldDescriptor::TypeOnceInit;
      local_140._M_dataplus._M_p = (pointer)paVar8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar8->_M_local_buf + 0x18),
                 (_func_void_FieldDescriptor_ptr **)local_100,(FieldDescriptor **)&local_140);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                (ulong)(byte)*(FieldDescriptor *)(paVar8->_M_local_buf + 2) * 4) == 10) {
      pDVar7 = FieldDescriptor::message_type(this->descriptor_);
      bVar3 = ShouldVerify(pDVar7,options,this->scc_analyzer_);
      if ((bVar3) &&
         (bVar3 = ShouldVerify(*(Descriptor **)(this->descriptor_ + 0x20),options,
                               this->scc_analyzer_), bVar3)) {
        pDVar7 = FieldDescriptor::message_type(this->descriptor_);
        ClassName_abi_cxx11_(&local_140,(cpp *)pDVar7,(Descriptor *)0x1,(bool)qualified);
        bVar3 = IsScoped(this);
        if (bVar3) {
          pFVar1 = this->descriptor_;
          pDVar7 = extraout_RDX;
          if (((byte)pFVar1[1] & 8) == 0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.h"
                       ,0x8d0);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)local_100,"CHECK failed: is_extension_: ");
            internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
            internal::LogMessage::~LogMessage((LogMessage *)local_100);
            pDVar7 = extraout_RDX_00;
          }
          ClassName_abi_cxx11_(&local_120,*(cpp **)(pFVar1 + 0x28),pDVar7);
        }
        else {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
        }
        Formatter::operator()
                  (&local_68,
                   "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n    $1$, $number$> $2$_$name$_register;\n"
                   ,&local_140,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_68.vars_._M_t);
  }
  return;
}

Assistant:

void ExtensionGenerator::GenerateDefinition(io::Printer* printer) {
  // If we are building for lite with implicit weak fields, we want to skip over
  // any custom options (i.e. extensions of messages from descriptor.proto).
  // This prevents the creation of any unnecessary linker references to the
  // descriptor messages.
  if (options_.lite_implicit_weak_fields &&
      descriptor_->containing_type()->file()->name() ==
          "net/proto2/proto/descriptor.proto") {
    return;
  }

  Formatter format(printer, variables_);
  std::string default_str;
  // If this is a class member, it needs to be declared in its class scope.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    // We need to declare a global string which will contain the default value.
    // We cannot declare it at class scope because that would require exposing
    // it in the header which would be annoying for other reasons.  So we
    // replace :: with _ in the name and declare it as a global.
    default_str =
        StringReplace(variables_["scoped_name"], "::", "_", true) + "_default";
    format("const std::string $1$($2$);\n", default_str,
           DefaultValue(options_, descriptor_));
  } else if (descriptor_->message_type()) {
    // We have to initialize the default instance for extensions at registration
    // time.
    default_str =
        FieldMessageTypeName(descriptor_, options_) + "::default_instance()";
  } else {
    default_str = DefaultValue(options_, descriptor_);
  }

  // Likewise, class members need to declare the field constant variable.
  if (IsScoped()) {
    format(
        "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\n"
        "const int $scope$$constant_name$;\n"
        "#endif\n");
  }

  format(
      "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
      "::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n"
      "    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n"
      "  $scoped_name$($constant_name$, $1$);\n",
      default_str);

  // Register extension verify function if needed.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      ShouldVerify(descriptor_->message_type(), options_, scc_analyzer_) &&
      ShouldVerify(descriptor_->containing_type(), options_, scc_analyzer_)) {
    format(
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n"
        "    $1$, $number$> $2$_$name$_register;\n",
        ClassName(descriptor_->message_type(), true),
        IsScoped() ? ClassName(descriptor_->extension_scope(), false) : "");
  }
}